

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O1

bool __thiscall
ON_V5ExtrusionDisplayMeshCache::Write
          (ON_V5ExtrusionDisplayMeshCache *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  bool bVar2;
  ON_Mesh *pOVar3;
  ulong uVar4;
  ON_Mesh *meshes [3];
  ON_Mesh *local_38 [4];
  
  bVar1 = ON_BinaryArchive::Save3dmRenderMesh(binary_archive,extrusion_object);
  local_38[0] = (this->m_render_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  pOVar3 = (this->m_analysis_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38[1] = pOVar3;
  local_38[2] = (ON_Mesh *)0x0;
  if (local_38[0] != (ON_Mesh *)0x0) {
    bVar2 = ON_Mesh::IsEmpty(local_38[0]);
    if (bVar2) {
      local_38[0] = (ON_Mesh *)0x0;
    }
  }
  if (pOVar3 != (ON_Mesh *)0x0) {
    bVar2 = ON_Mesh::IsEmpty(pOVar3);
    if (bVar2) {
      local_38[1] = (ON_Mesh *)0x0;
    }
  }
  uVar4 = 0;
  do {
    if (bVar1) {
      pOVar3 = local_38[uVar4];
    }
    else {
      pOVar3 = (ON_Mesh *)0x0;
    }
    bVar2 = ON_BinaryArchive::WriteObject(binary_archive,(ON_Object *)pOVar3);
  } while ((uVar4 < 2) && (uVar4 = uVar4 + 1, bVar2));
  return bVar2;
}

Assistant:

bool ON_V5ExtrusionDisplayMeshCache::Write(ON_BinaryArchive& binary_archive) const
{
  bool rc = true;
  bool bSaveMeshes = binary_archive.Save3dmRenderMesh(ON::extrusion_object);
  const ON_Mesh* meshes[3] = { m_render_mesh.get(), m_analysis_mesh.get(), nullptr };
  if (nullptr != meshes[0] && meshes[0]->IsEmpty())
    meshes[0] = nullptr;
  if (nullptr != meshes[1] && meshes[1]->IsEmpty())
    meshes[1] = nullptr;
  for(size_t i = 0; i < sizeof(meshes)/sizeof(meshes[0]) && rc; i++ )
  {
    const ON_Mesh* mesh = bSaveMeshes ? meshes[i] : nullptr;
    rc = binary_archive.WriteObject(mesh);
  }
  return rc;
}